

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  byte bVar1;
  Fts5Config *pFVar2;
  char *pcVar3;
  int iVar4;
  byte *z;
  Fts5Colset *pFVar5;
  ulong uVar6;
  int in_ECX;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  z = (byte *)sqlite3Fts5Strndup(&pParse->rc,(char *)p,in_ECX);
  if (pParse->rc != 0) goto LAB_001defbf;
  pFVar2 = pParse->pConfig;
  if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
    fts5Dequote((char *)z);
  }
  iVar4 = pFVar2->nCol;
  if ((long)iVar4 < 1) {
    lVar11 = 0;
LAB_001def41:
    iVar10 = (int)lVar11;
    if (iVar10 == iVar4) goto LAB_001def46;
    if (pColset == (Fts5Colset *)0x0) {
      iVar4 = sqlite3_initialize();
      if ((iVar4 == 0) && (pFVar5 = (Fts5Colset *)sqlite3Malloc(8), pFVar5 != (Fts5Colset *)0x0)) {
        uVar8 = 0;
        uVar7 = 0;
        goto LAB_001df016;
      }
    }
    else {
      uVar7 = pColset->nCol;
      uVar8 = (ulong)uVar7;
      iVar4 = sqlite3_initialize();
      if ((iVar4 == 0) &&
         (pFVar5 = (Fts5Colset *)sqlite3Realloc(pColset,(long)(int)uVar7 * 4 + 8),
         pFVar5 != (Fts5Colset *)0x0)) {
        if (0 < (int)uVar7) {
          uVar6 = 0;
LAB_001def8e:
          if (pFVar5->aiCol[uVar6] != iVar10) {
            if (pFVar5->aiCol[uVar6] <= iVar10) goto code_r0x001def9b;
            if ((int)uVar6 < (int)uVar7) {
              do {
                pFVar5->aiCol[uVar8] = pFVar5->aiCol[uVar8 - 1];
                uVar8 = uVar8 - 1;
              } while ((long)uVar6 < (long)uVar8);
            }
            uVar8 = uVar6 & 0xffffffff;
            goto LAB_001df016;
          }
          goto LAB_001df023;
        }
        uVar8 = 0;
LAB_001df016:
        pFVar5->aiCol[uVar8] = iVar10;
        pFVar5->nCol = uVar7 + 1;
LAB_001df023:
        sqlite3_free(z);
        return pFVar5;
      }
    }
    pParse->rc = 7;
  }
  else {
    lVar11 = 0;
    do {
      pcVar3 = pFVar2->azCol[lVar11];
      if (pcVar3 != (char *)0x0) {
        lVar9 = 0;
        do {
          bVar1 = pcVar3[lVar9];
          if (bVar1 == z[lVar9]) {
            if ((ulong)bVar1 == 0) goto LAB_001def41;
          }
          else if (""[bVar1] != ""[z[lVar9]]) break;
          lVar9 = lVar9 + 1;
        } while( true );
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar4);
LAB_001def46:
    sqlite3Fts5ParseError(pParse,"no such column: %s",z);
  }
  sqlite3_free(z);
LAB_001defbf:
  sqlite3_free(pColset);
  return (Fts5Colset *)0x0;
code_r0x001def9b:
  uVar6 = uVar6 + 1;
  if (uVar8 == uVar6) goto LAB_001df016;
  goto LAB_001def8e;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}